

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O2

word Abc_Isop14Cover(word *pOn,word *pOnDc,word *pRes,word CostLim,int *pCover)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  long lVar4;
  word Cost0;
  word Cost1;
  word wVar5;
  ulong uVar6;
  int *piVar7;
  word uOn2 [128];
  word uRes1 [128];
  word uRes0 [128];
  word uRes2 [128];
  word uOnDc2 [128];
  
  for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
    uOn2[lVar4] = ~pOnDc[lVar4 + 0x80] & pOn[lVar4];
  }
  Cost0 = Abc_IsopCheck(uOn2,pOnDc,uRes0,0xd,CostLim,pCover);
  if (Cost0 < CostLim) {
    for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
      uOn2[lVar4] = ~pOnDc[lVar4] & pOn[lVar4 + 0x80];
    }
    piVar7 = pCover + ((long)Cost0 >> 0x20);
    if (pCover == (int *)0x0) {
      piVar7 = (int *)0x0;
    }
    Cost1 = Abc_IsopCheck(uOn2,pOnDc + 0x80,uRes1,0xd,CostLim,piVar7);
    if (Cost0 + Cost1 < CostLim) {
      for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 8) {
        *(ulong *)((long)uOn2 + lVar4) =
             ~*(ulong *)((long)uRes1 + lVar4) & *(ulong *)((long)pOn + lVar4 + 0x400) |
             ~*(ulong *)((long)uRes0 + lVar4) & *(ulong *)((long)pOn + lVar4);
        *(ulong *)((long)uOnDc2 + lVar4) =
             *(ulong *)((long)pOnDc + lVar4 + 0x400) & *(ulong *)((long)pOnDc + lVar4);
      }
      piVar7 = pCover + ((long)Cost0 >> 0x20) + ((long)Cost1 >> 0x20);
      if (pCover == (int *)0x0) {
        piVar7 = (int *)0x0;
      }
      wVar5 = Abc_IsopCheck(uOn2,uOnDc2,uRes2,0xd,CostLim,piVar7);
      uVar6 = wVar5 + Cost0 + Cost1;
      if (uVar6 < CostLim) {
        for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 1) {
          uVar3 = uRes2[lVar4];
          pRes[lVar4] = uRes0[lVar4] | uVar3;
          pRes[lVar4 + 0x80] = uVar3 | uRes1[lVar4];
        }
        lVar4 = 0;
        while (lVar4 != 0x100) {
          puVar1 = pRes + lVar4;
          if (((pOn[lVar4] & ~*puVar1) != 0) ||
             (puVar2 = pOnDc + lVar4, lVar4 = lVar4 + 1, (*puVar1 & ~*puVar2) != 0)) {
            __assert_fail("(pOn[c] & ~pRes[c] ) == 0 && (pRes[c] & ~pOnDc[c]) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                          ,0x170,"word Abc_Isop14Cover(word *, word *, word *, word, int *)");
          }
        }
        Abc_IsopAddLits(pCover,Cost0,Cost1,0xd);
        CostLim = ((long)Cost1 >> 0x20) + ((long)Cost0 >> 0x20) + uVar6;
      }
    }
  }
  return CostLim;
}

Assistant:

word Abc_Isop14Cover( word * pOn, word * pOnDc, word * pRes, word CostLim, int * pCover )
{
    word uOn2[128], uOnDc2[128], uRes0[128], uRes1[128], uRes2[128];
    word Cost0, Cost1, Cost2; int c, nVars = 13, nWords = 128;
    // negative cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = pOn[c] & ~pOnDc[c+nWords];
    Cost0 = Abc_IsopCheck( uOn2, pOnDc,        uRes0, nVars, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    // positive cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = pOn[c+nWords] & ~pOnDc[c];
    Cost1 = Abc_IsopCheck( uOn2, pOnDc+nWords, uRes1, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    // middle cofactor
    for ( c = 0; c < nWords; c++ )
        uOn2[c] = (pOn[c] & ~uRes0[c]) | (pOn[c+nWords] & ~uRes1[c]), uOnDc2[c] = pOnDc[c] & pOnDc[c+nWords];
    Cost2 = Abc_IsopCheck( uOn2, uOnDc2,       uRes2, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    for ( c = 0; c < nWords; c++ )
        pRes[c] = uRes2[c] | uRes0[c], pRes[c+nWords] = uRes2[c] | uRes1[c];
    // verify
    for ( c = 0; c < (nWords<<1); c++ )
        assert( (pOn[c]  & ~pRes[c] ) == 0 && (pRes[c] & ~pOnDc[c]) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, nVars );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}